

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O1

void __thiscall UtestShell::runOneTest(UtestShell *this,TestPlugin *plugin,TestResult *result)

{
  int iVar1;
  code *pcVar2;
  HelperTestRunInfo runInfo;
  UtestShell *local_38;
  TestPlugin *local_30;
  TestResult *local_28;
  
  this->hasFailed_ = false;
  (*result->_vptr_TestResult[9])(result);
  local_38 = this;
  local_30 = plugin;
  local_28 = result;
  iVar1 = (*this->_vptr_UtestShell[0x1f])(this);
  pcVar2 = helperDoRunOneTestInCurrentProcess;
  if ((char)iVar1 != '\0') {
    pcVar2 = helperDoRunOneTestSeperateProcess;
  }
  (*PlatformSpecificSetJmp)(pcVar2,&local_38);
  return;
}

Assistant:

void UtestShell::runOneTest(TestPlugin* plugin, TestResult& result)
{
    hasFailed_ = false;
    result.countRun();
    HelperTestRunInfo runInfo(this, plugin, &result);
    if (isRunInSeperateProcess())
        PlatformSpecificSetJmp(helperDoRunOneTestSeperateProcess, &runInfo);
    else
        PlatformSpecificSetJmp(helperDoRunOneTestInCurrentProcess, &runInfo);
}